

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wrappers.pb.cc
# Opt level: O3

uint8 * __thiscall
google::protobuf::Int64Value::_InternalSerialize
          (Int64Value *this,uint8 *target,EpsCopyOutputStream *stream)

{
  void *pvVar1;
  bool bVar2;
  ulong uVar3;
  ulong uVar4;
  uint8 *puVar5;
  
  uVar3 = this->value_;
  if (uVar3 != 0) {
    if (stream->end_ <= target) {
      target = io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
      uVar3 = this->value_;
    }
    *target = '\b';
    if (uVar3 < 0x80) {
      target[1] = (byte)uVar3;
      target = target + 2;
    }
    else {
      target[1] = (byte)uVar3 | 0x80;
      if (uVar3 < 0x4000) {
        target[2] = (uint8)(uVar3 >> 7);
        target = target + 3;
      }
      else {
        uVar3 = uVar3 >> 7;
        target = target + 3;
        do {
          puVar5 = target;
          puVar5[-1] = (byte)uVar3 | 0x80;
          uVar4 = uVar3 >> 7;
          target = puVar5 + 1;
          bVar2 = 0x3fff < uVar3;
          uVar3 = uVar4;
        } while (bVar2);
        *puVar5 = (uint8)uVar4;
      }
    }
  }
  pvVar1 = (this->super_Message).super_MessageLite._internal_metadata_.ptr_;
  if (((ulong)pvVar1 & 1) == 0) {
    return target;
  }
  puVar5 = internal::WireFormat::InternalSerializeUnknownFieldsToArray
                     ((UnknownFieldSet *)(((ulong)pvVar1 & 0xfffffffffffffffe) + 8),target,stream);
  return puVar5;
}

Assistant:

::PROTOBUF_NAMESPACE_ID::uint8* Int64Value::_InternalSerialize(
    ::PROTOBUF_NAMESPACE_ID::uint8* target, ::PROTOBUF_NAMESPACE_ID::io::EpsCopyOutputStream* stream) const {
  // @@protoc_insertion_point(serialize_to_array_start:google.protobuf.Int64Value)
  ::PROTOBUF_NAMESPACE_ID::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  // int64 value = 1;
  if (this->value() != 0) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::WriteInt64ToArray(1, this->_internal_value(), target);
  }

  if (PROTOBUF_PREDICT_FALSE(_internal_metadata_.have_unknown_fields())) {
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormat::InternalSerializeUnknownFieldsToArray(
        _internal_metadata_.unknown_fields<::PROTOBUF_NAMESPACE_ID::UnknownFieldSet>(::PROTOBUF_NAMESPACE_ID::UnknownFieldSet::default_instance), target, stream);
  }
  // @@protoc_insertion_point(serialize_to_array_end:google.protobuf.Int64Value)
  return target;
}